

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O3

void * __thiscall cnn::AlignedMemoryPool::allocate(AlignedMemoryPool *this,size_t n)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = this->a->align;
  if (1 < (int)uVar1) {
    uVar3 = (n + uVar1) - 1;
    n = uVar3 - uVar3 % (ulong)uVar1;
  }
  sVar2 = this->used;
  uVar3 = n + sVar2;
  if (uVar3 <= this->capacity) {
    this->used = uVar3;
    return (void *)(sVar2 + (long)this->mem);
  }
  std::operator<<((ostream *)&std::cerr,"cnn is out of memory, try increasing with --cnn-mem\n");
  abort();
}

Assistant:

void* allocate(size_t n) {
    auto rounded_n = a->round_up_align(n);
    if (rounded_n + used > capacity) {
      std::cerr << "cnn is out of memory, try increasing with --cnn-mem\n";
      abort();
    }
    void* res = static_cast<char*>(mem) + used;
    used += rounded_n;
    return res;
  }